

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O3

double __thiscall hdc::SymbolTableBuilderVisitor::log(SymbolTableBuilderVisitor *this,double __x)

{
  Logger *this_00;
  long in_RSI;
  double dVar1;
  double extraout_XMM0_Qa;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 *local_38;
  undefined1 local_28 [16];
  
  this_00 = this->logger;
  if (this_00 != (Logger *)0x0) {
    dVar1 = (double)std::__cxx11::stringbuf::str();
    Logger::log(this_00,dVar1);
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  dVar1 = (double)std::__cxx11::stringbuf::str((string *)(in_RSI + 0x18));
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
    dVar1 = extraout_XMM0_Qa;
  }
  return dVar1;
}

Assistant:

void SymbolTableBuilderVisitor::log(std::stringstream& msg) {
    if (logger != nullptr) {
        logger->log(LOG_INTERNAL_SYMBOL_TABLE, msg.str());
    }

    msg.str("");
}